

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O0

void integer_mv_precision(MV *mv)

{
  int iVar1;
  int iVar2;
  int mod;
  MV *mv_local;
  
  iVar2 = (int)mv->row % 8;
  if (iVar2 != 0) {
    mv->row = mv->row - (short)iVar2;
    iVar1 = iVar2;
    if (iVar2 < 1) {
      iVar1 = -iVar2;
    }
    if (4 < iVar1) {
      if (iVar2 < 1) {
        mv->row = mv->row + -8;
      }
      else {
        mv->row = mv->row + 8;
      }
    }
  }
  iVar2 = (int)mv->col % 8;
  if (iVar2 != 0) {
    mv->col = mv->col - (short)iVar2;
    iVar1 = iVar2;
    if (iVar2 < 1) {
      iVar1 = -iVar2;
    }
    if (4 < iVar1) {
      if (iVar2 < 1) {
        mv->col = mv->col + -8;
      }
      else {
        mv->col = mv->col + 8;
      }
    }
  }
  return;
}

Assistant:

static inline void integer_mv_precision(MV *mv) {
  int mod = (mv->row % 8);
  if (mod != 0) {
    mv->row -= mod;
    if (abs(mod) > 4) {
      if (mod > 0) {
        mv->row += 8;
      } else {
        mv->row -= 8;
      }
    }
  }

  mod = (mv->col % 8);
  if (mod != 0) {
    mv->col -= mod;
    if (abs(mod) > 4) {
      if (mod > 0) {
        mv->col += 8;
      } else {
        mv->col -= 8;
      }
    }
  }
}